

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckType(ScalarReplacementPass *this,Instruction *typeInst)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  bool bVar4;
  
  bVar1 = CheckTypeAnnotations(this,typeInst);
  if (bVar1) {
    if (typeInst->opcode_ == OpTypeArray) {
      uVar2 = Instruction::GetSingleWordInOperand(typeInst,1);
      bVar1 = IsSpecConstant(this,uVar2);
      if (!bVar1) {
        uVar3 = GetArrayLength(this,typeInst);
        bVar4 = (ulong)this->max_num_elements_ == 0;
        bVar1 = uVar3 <= this->max_num_elements_;
        goto LAB_00188add;
      }
    }
    else if ((typeInst->opcode_ == OpTypeStruct) &&
            (uVar2 = Instruction::NumInOperands(typeInst), uVar2 != 0)) {
      uVar2 = Instruction::NumInOperands(typeInst);
      bVar4 = this->max_num_elements_ == 0;
      bVar1 = uVar2 <= this->max_num_elements_;
LAB_00188add:
      return (bool)(bVar1 | bVar4);
    }
  }
  return false;
}

Assistant:

bool ScalarReplacementPass::CheckType(const Instruction* typeInst) const {
  if (!CheckTypeAnnotations(typeInst)) {
    return false;
  }

  switch (typeInst->opcode()) {
    case spv::Op::OpTypeStruct:
      // Don't bother with empty structs or very large structs.
      if (typeInst->NumInOperands() == 0 ||
          IsLargerThanSizeLimit(typeInst->NumInOperands())) {
        return false;
      }
      return true;
    case spv::Op::OpTypeArray:
      if (IsSpecConstant(typeInst->GetSingleWordInOperand(1u))) {
        return false;
      }
      if (IsLargerThanSizeLimit(GetArrayLength(typeInst))) {
        return false;
      }
      return true;
      // TODO(alanbaker): Develop some heuristics for when this should be
      // re-enabled.
      //// Specifically including matrix and vector in an attempt to reduce the
      //// number of vector registers required.
      // case spv::Op::OpTypeMatrix:
      // case spv::Op::OpTypeVector:
      //  if (IsLargerThanSizeLimit(GetNumElements(typeInst))) return false;
      //  return true;

    case spv::Op::OpTypeRuntimeArray:
    default:
      return false;
  }
}